

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

ImFont * __thiscall
ImFontAtlas::AddFontFromMemoryCompressedBase85TTF
          (ImFontAtlas *this,char *compressed_ttf_data_base85,float size_pixels,
          ImFontConfig *font_cfg,ImWchar *glyph_ranges)

{
  ImGuiContext *pIVar1;
  int iVar2;
  size_t sVar3;
  int *piVar4;
  int *piVar5;
  ImFont *pIVar6;
  char cVar7;
  char *pcVar8;
  
  sVar3 = strlen(compressed_ttf_data_base85);
  pIVar1 = GImGui;
  iVar2 = (int)sVar3 + 4;
  iVar2 = ((uint)((ulong)((long)iVar2 * 0x66666667) >> 0x21) - (iVar2 >> 0x1f)) * 4;
  piVar4 = &(GImGui->IO).MetricsAllocs;
  *piVar4 = *piVar4 + 1;
  piVar4 = (int *)(*(pIVar1->IO).MemAllocFn)((long)iVar2);
  cVar7 = *compressed_ttf_data_base85;
  if (cVar7 != '\0') {
    pcVar8 = compressed_ttf_data_base85 + 5;
    piVar5 = piVar4;
    do {
      *piVar5 = (((((0x5b < pcVar8[-1] ^ 0xffffffdd) + (int)pcVar8[-1]) * 0x55 +
                  (0x5b < pcVar8[-2] ^ 0xffffffdd) + (int)pcVar8[-2]) * 0x55 +
                 (0x5b < pcVar8[-3] ^ 0xffffffdd) + (int)pcVar8[-3]) * 0x55 +
                (0x5b < pcVar8[-4] ^ 0xffffffdd) + (int)pcVar8[-4]) * 0x55 +
                ('[' < cVar7 ^ 0xffffffdd) + (int)cVar7;
      piVar5 = piVar5 + 1;
      cVar7 = *pcVar8;
      pcVar8 = pcVar8 + 5;
    } while (cVar7 != '\0');
  }
  pIVar6 = AddFontFromMemoryCompressedTTF(this,piVar4,iVar2,size_pixels,font_cfg,glyph_ranges);
  if (piVar4 != (int *)0x0) {
    piVar5 = &(GImGui->IO).MetricsAllocs;
    *piVar5 = *piVar5 + -1;
  }
  (*(GImGui->IO).MemFreeFn)(piVar4);
  return pIVar6;
}

Assistant:

ImFont* ImFontAtlas::AddFontFromMemoryCompressedBase85TTF(const char* compressed_ttf_data_base85, float size_pixels, const ImFontConfig* font_cfg, const ImWchar* glyph_ranges)
{
    int compressed_ttf_size = (((int)strlen(compressed_ttf_data_base85) + 4) / 5) * 4;
    void* compressed_ttf = ImGui::MemAlloc((size_t)compressed_ttf_size);
    Decode85((const unsigned char*)compressed_ttf_data_base85, (unsigned char*)compressed_ttf);
    ImFont* font = AddFontFromMemoryCompressedTTF(compressed_ttf, compressed_ttf_size, size_pixels, font_cfg, glyph_ranges);
    ImGui::MemFree(compressed_ttf);
    return font;
}